

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

string * __thiscall
spirv_cross::CompilerMSL::to_swizzle_expression_abi_cxx11_
          (string *__return_storage_ptr__,CompilerMSL *this,uint32_t id)

{
  Variant *pVVar1;
  ulong uVar2;
  SPIRCombinedImageSampler *pSVar3;
  long lVar4;
  long *plVar5;
  size_type *psVar6;
  size_type sVar7;
  string *__range1;
  string expr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> array_expr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> image_expr;
  string local_a8;
  undefined1 *local_88 [2];
  undefined1 local_78 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  uVar2 = (ulong)id;
  if ((uVar2 < (this->super_CompilerGLSL).super_Compiler.ir.ids.
               super_VectorView<spirv_cross::Variant>.buffer_size) &&
     (pVVar1 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
               super_VectorView<spirv_cross::Variant>.ptr,
     pVVar1[uVar2].type == TypeCombinedImageSampler)) {
    pSVar3 = Variant::get<spirv_cross::SPIRCombinedImageSampler>(pVVar1 + uVar2);
  }
  else {
    pSVar3 = (SPIRCombinedImageSampler *)0x0;
  }
  if (pSVar3 != (SPIRCombinedImageSampler *)0x0) {
    id = (pSVar3->image).id;
  }
  CompilerGLSL::to_expression_abi_cxx11_(&local_a8,&this->super_CompilerGLSL,id,true);
  lVar4 = ::std::__cxx11::string::find((char)&local_a8,0x5b);
  if (local_a8._M_string_length != 0) {
    sVar7 = 0;
    do {
      if (local_a8._M_dataplus._M_p[sVar7] == '.') {
        local_a8._M_dataplus._M_p[sVar7] = '_';
      }
      sVar7 = sVar7 + 1;
    } while (local_a8._M_string_length != sVar7);
  }
  if (lVar4 == -1) {
    ::std::operator+(__return_storage_ptr__,&local_a8,&this->swizzle_name_suffix);
  }
  else {
    ::std::__cxx11::string::substr((ulong)&local_48,(ulong)&local_a8);
    ::std::__cxx11::string::substr((ulong)local_88,(ulong)&local_a8);
    ::std::operator+(&local_68,&local_48,&this->swizzle_name_suffix);
    plVar5 = (long *)::std::__cxx11::string::_M_append((char *)&local_68,(ulong)local_88[0]);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar6 = (size_type *)(plVar5 + 2);
    if ((size_type *)*plVar5 == psVar6) {
      lVar4 = plVar5[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar4;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar5;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
    }
    __return_storage_ptr__->_M_string_length = plVar5[1];
    *plVar5 = (long)psVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    if (local_88[0] != local_78) {
      operator_delete(local_88[0]);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerMSL::to_swizzle_expression(uint32_t id)
{
	auto *combined = maybe_get<SPIRCombinedImageSampler>(id);

	auto expr = to_expression(combined ? combined->image : VariableID(id));
	auto index = expr.find_first_of('[');

	// If an image is part of an argument buffer translate this to a legal identifier.
	for (auto &c : expr)
		if (c == '.')
			c = '_';

	if (index == string::npos)
		return expr + swizzle_name_suffix;
	else
	{
		auto image_expr = expr.substr(0, index);
		auto array_expr = expr.substr(index);
		return image_expr + swizzle_name_suffix + array_expr;
	}
}